

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

void __thiscall TcpServerImpl::Close(TcpServerImpl *this)

{
  std::function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&)>::operator=
            (&this->m_fNewConnection,(nullptr_t)0x0);
  (this->super_BaseSocketImpl).m_bStop = true;
  return;
}

Assistant:

void TcpServerImpl::Close() noexcept
{
    m_fNewConnection = nullptr;
    m_bStop = true; // Stops the listening thread, deletes all Sockets at the end of the listening thread
}